

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FlowGraph.cpp
# Opt level: O3

void __thiscall
FlowGraph::WalkLoopBlocks(FlowGraph *this,BasicBlock *block,Loop *loop,JitArenaAllocator *tempAlloc)

{
  uint uVar1;
  code *pcVar2;
  bool bVar3;
  BOOLEAN BVar4;
  ImplicitCallFlags newFlags;
  ushort uVar5;
  BasicBlock *block_1;
  undefined4 *puVar6;
  Loop *this_00;
  Type *ppFVar7;
  BasicBlock *pBVar8;
  Loop *pLVar9;
  Loop *pLVar10;
  char *this_01;
  BasicBlock *local_48;
  BasicBlock *local_40;
  BasicBlock *local_38;
  
  if (loop == (Loop *)0x0) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar6 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar6 = 1;
    bVar3 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/FlowGraph.cpp"
                       ,0x553,"(loop)","loop");
    if (!bVar3) {
LAB_0041673d:
      pcVar2 = (code *)invalidInstructionException();
      (*pcVar2)();
    }
    *puVar6 = 0;
  }
  this_00 = (Loop *)new<Memory::JitArenaAllocator>(0x20,tempAlloc,0x3eba5c);
  this_00->implicitCallFlags = ImplicitCall_HasNoInfo;
  this_00->loopFlags = (LoopFlags)0x0;
  *(undefined6 *)&this_00->field_0x2 = 0;
  this_00->headBlock = (BasicBlock *)0x0;
  this_00->topFunc = (Func *)tempAlloc;
  *(Loop **)&this_00->loopNumber = this_00;
  pLVar9 = this_00;
  BVSparse<Memory::JitArenaAllocator>::Set
            ((BVSparse<Memory::JitArenaAllocator> *)this_00,block->number);
  AddBlockToLoop((FlowGraph *)pLVar9,block,loop);
  if (loop->headBlock != block) {
    puVar6 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    pBVar8 = block;
    do {
      this_01 = (char *)this_00;
      BVar4 = BVSparse<Memory::JitArenaAllocator>::Test
                        ((BVSparse<Memory::JitArenaAllocator> *)this_00,pBVar8->number);
      local_48 = (BasicBlock *)&pBVar8->succList;
      local_40 = local_48;
      local_38 = pBVar8;
      while( true ) {
        if (local_40 == (BasicBlock *)0x0) {
          AssertCount = AssertCount + 1;
          Js::Throw::LogAssert();
          *puVar6 = 1;
          this_01 = 
          "/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/DataStructures/SList.h"
          ;
          bVar3 = Js::Throw::ReportAssert
                            ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/DataStructures/SList.h"
                             ,0x76,"(current != nullptr)","current != nullptr");
          if (!bVar3) goto LAB_0041673d;
          *puVar6 = 0;
        }
        pBVar8 = (BasicBlock *)
                 (((ArenaAllocator *)&local_40->next)->
                 super_ArenaAllocatorBase<Memory::InPlaceFreeListPolicy,_4UL,_false,_0UL>).
                 super_Allocator.outOfMemoryFunc;
        if (pBVar8 == local_48) break;
        this_01 = (char *)&stack0xffffffffffffffb8;
        local_40 = pBVar8;
        ppFVar7 = SListBase<FlowEdge_*,_Memory::ArenaAllocator,_RealCount>::Iterator::Data
                            ((Iterator *)&stack0xffffffffffffffb8);
        pBVar8 = (*ppFVar7)->succBlock;
        if (pBVar8 == (BasicBlock *)0x0) {
          AssertCount = AssertCount + 1;
          Js::Throw::LogAssert();
          *puVar6 = 1;
          this_01 = 
          "/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/FlowGraph.cpp"
          ;
          bVar3 = Js::Throw::ReportAssert
                            ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/FlowGraph.cpp"
                             ,0x566,"(succ)","succ");
          if (!bVar3) goto LAB_0041673d;
          *puVar6 = 0;
        }
        if ((pBVar8->field_0x18 & 4) != 0) {
          if (loop->headBlock == pBVar8) {
            BVar4 = '\x01';
          }
          else if ((pBVar8->loop == (Loop *)0x0) || (pBVar8->loop->headBlock != pBVar8)) {
            pLVar9 = loop;
            if (BVar4 == '\0') {
              pLVar9 = (Loop *)0x0;
            }
            this_01 = (char *)this;
            BuildLoop(this,pBVar8,local_38,pLVar9);
          }
        }
      }
      pBVar8 = local_38;
      if (BVar4 != '\0') {
        local_48 = (BasicBlock *)&local_38->predList;
        local_40 = local_48;
        while( true ) {
          if (local_40 == (BasicBlock *)0x0) {
            AssertCount = AssertCount + 1;
            Js::Throw::LogAssert();
            *puVar6 = 1;
            this_01 = 
            "/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/DataStructures/SList.h"
            ;
            bVar3 = Js::Throw::ReportAssert
                              ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/DataStructures/SList.h"
                               ,0x76,"(current != nullptr)","current != nullptr");
            if (!bVar3) goto LAB_0041673d;
            *puVar6 = 0;
          }
          pBVar8 = (BasicBlock *)
                   (((ArenaAllocator *)&local_40->next)->
                   super_ArenaAllocatorBase<Memory::InPlaceFreeListPolicy,_4UL,_false,_0UL>).
                   super_Allocator.outOfMemoryFunc;
          if (pBVar8 == local_48) break;
          local_40 = pBVar8;
          ppFVar7 = SListBase<FlowEdge_*,_Memory::ArenaAllocator,_RealCount>::Iterator::Data
                              ((Iterator *)&stack0xffffffffffffffb8);
          pBVar8 = (*ppFVar7)->predBlock;
          if (pBVar8 == (BasicBlock *)0x0) {
            AssertCount = AssertCount + 1;
            Js::Throw::LogAssert();
            *puVar6 = 1;
            bVar3 = Js::Throw::ReportAssert
                              ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/FlowGraph.cpp"
                               ,0x57a,"(pred)","pred");
            if (!bVar3) goto LAB_0041673d;
            *puVar6 = 0;
          }
          pLVar9 = pBVar8->loop;
          if (((pLVar9 != loop && pLVar9 != (Loop *)0x0) &&
              (uVar1 = loop->headBlock->number, uVar1 < pLVar9->headBlock->number)) &&
             ((pLVar9->parent == (Loop *)0x0 || (pLVar9->parent->headBlock->number < uVar1)))) {
            pLVar9->parent = loop;
            loop->field_0x179 = loop->field_0x179 & 0xfe;
            pLVar9 = pBVar8->loop;
            uVar5 = *(ushort *)&pLVar9->field_0x178;
            if ((uVar5 & 8) != 0) {
              Loop::SetHasCall(loop);
              pLVar9 = pBVar8->loop;
              uVar5 = *(ushort *)&pLVar9->field_0x178;
            }
            if ((uVar5 & 0x10) != 0) {
              Loop::SetHasYield(loop);
              pLVar9 = pBVar8->loop;
            }
            newFlags = Loop::GetImplicitCallFlags(pLVar9);
            Loop::SetImplicitCallFlags(loop,newFlags);
          }
          this_01 = (char *)this_00;
          BVSparse<Memory::JitArenaAllocator>::Set
                    ((BVSparse<Memory::JitArenaAllocator> *)this_00,pBVar8->number);
        }
        pLVar9 = local_38->loop;
        pLVar10 = loop;
        if (pLVar9 == loop || pLVar9 == (Loop *)0x0) {
LAB_004166fd:
          local_38->loop = loop;
        }
        else {
          do {
            pLVar10 = pLVar10->parent;
            if (pLVar10 == pLVar9) break;
          } while (pLVar10 != (Loop *)0x0);
          if (pLVar10 != (Loop *)0x0) goto LAB_004166fd;
        }
        pBVar8 = local_38;
        if (local_38 != block) {
          AddBlockToLoop((FlowGraph *)this_01,local_38,loop);
          pBVar8 = local_38;
        }
      }
      do {
        pBVar8 = pBVar8->prev;
      } while ((pBVar8->field_0x18 & 1) != 0);
    } while (local_38 != loop->headBlock);
  }
  return;
}

Assistant:

void
FlowGraph::WalkLoopBlocks(BasicBlock *block, Loop *loop, JitArenaAllocator *tempAlloc)
{
    AnalysisAssert(loop);

    BVSparse<JitArenaAllocator> *loopBlocksBv = JitAnew(tempAlloc, BVSparse<JitArenaAllocator>, tempAlloc);
    BasicBlock *tailBlock = block;
    BasicBlock *lastBlock;
    loopBlocksBv->Set(block->GetBlockNum());

    this->AddBlockToLoop(block, loop);

    if (block == loop->headBlock)
    {
        // Single block loop, we're done
        return;
    }

    do
    {
        BOOL isInLoop = loopBlocksBv->Test(block->GetBlockNum());

        FOREACH_SUCCESSOR_BLOCK(succ, block)
        {
            if (succ->isLoopHeader)
            {
                // Found a loop back-edge
                if (loop->headBlock == succ)
                {
                    isInLoop = true;
                }
                else if (succ->loop == nullptr || succ->loop->headBlock != succ)
                {
                    // Recurse on inner loop
                    BuildLoop(succ, block, isInLoop ? loop : nullptr);
                }
            }
        } NEXT_SUCCESSOR_BLOCK;

        if (isInLoop)
        {
            // This block is in the loop.  All of it's predecessors should be contained in the loop as well.
            FOREACH_PREDECESSOR_BLOCK(pred, block)
            {
                // Fix up loop parent if it isn't set already.
                // If pred->loop != loop, we're looking at an inner loop, which was already visited.
                // If pred->loop->parent == nullptr, this is the first time we see this loop from an outer
                // loop, so this must be an immediate child.
                if (pred->loop && pred->loop != loop && loop->headBlock->number < pred->loop->headBlock->number
                    && (pred->loop->parent == nullptr || pred->loop->parent->headBlock->number < loop->headBlock->number))
                {
                    pred->loop->parent = loop;
                    loop->isLeaf = false;
                    if (pred->loop->hasCall)
                    {
                        loop->SetHasCall();
                    }
                    if (pred->loop->hasYield)
                    {
                        loop->SetHasYield();
                    }
                    loop->SetImplicitCallFlags(pred->loop->GetImplicitCallFlags());
                }
                // Add pred to loop bit vector
                loopBlocksBv->Set(pred->GetBlockNum());
            } NEXT_PREDECESSOR_BLOCK;

            if (block->loop == nullptr || block->loop->IsDescendentOrSelf(loop))
            {
                block->loop = loop;
            }

            if (block != tailBlock)
            {
                this->AddBlockToLoop(block, loop);
            }
        }
        lastBlock = block;
        block = block->GetPrev();
    } while (lastBlock != loop->headBlock);
}